

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

int __thiscall Fl_Input_::position(Fl_Input_ *this,int p,int m)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int p_00;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  was_up_down = 0;
  if (p < 1) {
    p = 0;
  }
  uVar1 = this->size_;
  if ((int)uVar1 <= p) {
    p = uVar1;
  }
  uVar6 = (ulong)(uint)p;
  uVar8 = 0;
  if (0 < m) {
    uVar8 = m;
  }
  if ((int)uVar1 <= (int)uVar8) {
    uVar8 = uVar1;
  }
  uVar9 = (ulong)uVar8;
  uVar11 = (ulong)(uint)p;
  if (((0 < p) && (uVar11 = (ulong)(uint)p, p < this->position_)) &&
     (uVar11 = uVar6, p < (int)uVar1)) {
    while ((iVar4 = fl_utf8len(this->value_[uVar6]), uVar11 = uVar6, iVar4 < 1 &&
           (uVar11 = uVar6 - 1, 1 < (long)uVar6))) {
      if (((long)this->position_ < (long)uVar6) ||
         (bVar2 = (long)this->size_ < (long)uVar6, uVar6 = uVar11, bVar2)) break;
    }
  }
  iVar10 = (int)uVar11;
  lVar7 = (long)iVar10;
  iVar4 = fl_utf8len(this->value_[lVar7]);
  if (iVar10 < this->size_) {
    do {
      if ((lVar7 <= this->position_) || (-1 < iVar4)) break;
      lVar3 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      iVar4 = fl_utf8len(this->value_[lVar3]);
    } while (lVar7 < this->size_);
    iVar10 = (int)lVar7;
  }
  uVar6 = uVar9;
  if (((0 < (int)uVar8) && (uVar6 = (ulong)uVar8, (int)uVar8 < this->mark_)) &&
     (uVar6 = uVar9, (int)uVar8 < this->size_)) {
    while ((iVar4 = fl_utf8len(this->value_[uVar9]), uVar6 = uVar9, iVar4 < 1 &&
           (uVar6 = uVar9 - 1, 1 < (long)uVar9))) {
      if (((long)this->mark_ < (long)uVar9) ||
         (bVar2 = (long)this->size_ < (long)uVar9, uVar9 = uVar6, bVar2)) break;
    }
  }
  iVar4 = (int)uVar6;
  lVar7 = (long)iVar4;
  iVar5 = fl_utf8len(this->value_[lVar7]);
  if (iVar4 < this->size_) {
    do {
      if ((lVar7 <= this->mark_) || (-1 < iVar5)) break;
      lVar3 = lVar7 + 1;
      lVar7 = lVar7 + 1;
      iVar5 = fl_utf8len(this->value_[lVar3]);
    } while (lVar7 < this->size_);
    iVar4 = (int)lVar7;
  }
  if (p == uVar8) {
    iVar4 = iVar10;
  }
  p_00 = this->position_;
  iVar5 = this->mark_;
  if ((iVar10 == p_00) && (iVar4 == iVar5)) {
    return 0;
  }
  if (iVar10 == iVar4) {
    if (p_00 == iVar5) {
      if (((Fl_Input_ *)Fl::focus_ == this) && (((this->super_Fl_Widget).damage_ & 2) == 0)) {
        minimal_update(this,p_00);
        this->erase_cursor_only = '\x01';
      }
      goto LAB_001bbd72;
    }
    if (iVar5 < p_00) {
      p_00 = iVar5;
    }
  }
  else {
    if (iVar10 != p_00) {
      if (iVar10 < p_00) {
        p_00 = iVar10;
      }
      minimal_update(this,p_00);
    }
    p_00 = this->mark_;
    if (iVar4 == p_00) goto LAB_001bbd72;
    if (iVar4 < p_00) {
      p_00 = iVar4;
    }
  }
  minimal_update(this,p_00);
LAB_001bbd72:
  this->position_ = iVar10;
  this->mark_ = iVar4;
  return 1;
}

Assistant:

int Fl_Input_::position(int p, int m) {
  int is_same = 0;
  was_up_down = 0;
  if (p<0) p = 0;
  if (p>size()) p = size();
  if (m<0) m = 0;
  if (m>size()) m = size();
  if (p == m) is_same = 1;

  while (p < position_ && p > 0 && (size() - p) > 0 &&
       (fl_utf8len((char)(value() + p)[0]) < 1)) { p--; }
  int ul = fl_utf8len((char)(value() + p)[0]);
  while (p < size() && p > position_ && ul < 0) {
       p++;
       ul = fl_utf8len((char)(value() + p)[0]);
  }

  while (m < mark_ && m > 0 && (size() - m) > 0 &&
       (fl_utf8len((char)(value() + m)[0]) < 1)) { m--; }
  ul = fl_utf8len((char)(value() + m)[0]);
  while (m < size() && m > mark_ && ul < 0) {
       m++;
       ul = fl_utf8len((char)(value() + m)[0]);
  }
  if (is_same) m = p;
  if (p == position_ && m == mark_) return 0;


  //if (Fl::selection_owner() == this) Fl::selection_owner(0);
  if (p != m) {
    if (p != position_) minimal_update(position_, p);
    if (m != mark_) minimal_update(mark_, m);
  } else {
    // new position is a cursor
    if (position_ == mark_) {
      // old position was just a cursor
      if (Fl::focus() == this && !(damage()&FL_DAMAGE_EXPOSE)) {
	minimal_update(position_); erase_cursor_only = 1;
      }
    } else { // old position was a selection
      minimal_update(position_, mark_);
    }
  }
  position_ = p;
  mark_ = m;
  return 1;
}